

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O0

void createwords(void)

{
  size_t *this;
  int iVar1;
  int iVar2;
  int *piVar3;
  reference pvVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  size_type sVar8;
  iterator __first;
  iterator __last;
  reference __x;
  double dVar9;
  int local_1ec;
  undefined1 auStack_1e8 [4];
  int cp;
  paaword now;
  double tf;
  int inthisclass;
  int k_1;
  double idf;
  set<int,_std::less<int>,_std::allocator<int>_> local_130;
  int local_fc;
  undefined1 local_f8 [4];
  int k;
  set<int,_std::less<int>,_std::allocator<int>_> allselect;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  select;
  int inclasses;
  int j_4;
  int bucket_1;
  int j_3;
  double avg_1;
  undefined1 local_90 [4];
  int offset_1;
  vector<int,_std::allocator<int>_> qu_1;
  int start_1;
  int i_2;
  int j_2;
  int local_60;
  int local_5c;
  int bucket;
  int j_1;
  double avg;
  undefined1 local_48 [4];
  int offset;
  vector<int,_std::allocator<int>_> qu;
  int start;
  int i_1;
  int window;
  int d;
  int j;
  int i;
  int len;
  int local_c;
  int shapelet_minlen;
  
  len = 10;
  i = ((ts_len / 0x14 + 9) / 10) * 10;
  piVar3 = std::max<int>(&len,&i);
  j = *piVar3;
  local_c = j;
  for (; j <= ts_len; j = local_c + j) {
    for (d = 0; d < 5; d = d + 1) {
      for (window = 0; window <= num_c; window = window + 1) {
        std::
        map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
        ::clear(tree[d] + window);
      }
    }
    for (i_1 = 0; i_1 < 5; i_1 = i_1 + 1) {
      if (j % PAA_DIMENSION[i_1] == 0) {
        iVar2 = j / PAA_DIMENSION[i_1];
        for (qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ = 0;
            qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ < data_n;
            qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ =
                 qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage._4_4_ + 1) {
          for (qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._0_4_ = 0;
              (int)qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage < iVar2;
              qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._0_4_ =
                   (int)qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 1) {
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_48);
            for (avg._4_4_ = (int)qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage;
                avg._4_4_ + iVar2 <= ts_len; avg._4_4_ = iVar2 + avg._4_4_) {
              _bucket = 0.0;
              for (local_5c = avg._4_4_; local_5c < avg._4_4_ + iVar2; local_5c = local_5c + 1) {
                pvVar4 = std::
                         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ::operator[](&data_x,(long)qu.super__Vector_base<int,_std::allocator<int>_>
                                                    ._M_impl.super__Vector_impl_data.
                                                    _M_end_of_storage._4_4_);
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (pvVar4,(long)local_5c);
                _bucket = *pvVar5 + _bucket;
              }
              dVar9 = floor((_bucket / (double)iVar2 - min_data) / bucket_w + -1e-08);
              local_60 = (int)dVar9;
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)local_48,&local_60);
            }
            for (start_1 = 0; iVar1 = PAA_DIMENSION[i_1],
                sVar6 = std::vector<int,_std::allocator<int>_>::size
                                  ((vector<int,_std::allocator<int>_> *)local_48),
                (ulong)(long)(start_1 + iVar1) <= sVar6; start_1 = start_1 + 1) {
              insertintohashmap((vector<int,_std::allocator<int>_> *)local_48,start_1,i_1,
                                qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_,j,
                                (int)qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
            }
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)local_48);
          }
        }
        for (qu_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ = 0;
            qu_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ < data_n;
            qu_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ =
                 qu_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage._4_4_ + 1) {
          for (qu_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._0_4_ = 0;
              (int)qu_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage < iVar2;
              qu_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._0_4_ =
                   (int)qu_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 1) {
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_90);
            for (avg_1._4_4_ = (int)qu_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage;
                avg_1._4_4_ + iVar2 <= ts_len; avg_1._4_4_ = iVar2 + avg_1._4_4_) {
              _bucket_1 = 0.0;
              for (j_4 = avg_1._4_4_; j_4 < avg_1._4_4_ + iVar2; j_4 = j_4 + 1) {
                pvVar4 = std::
                         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ::operator[](&data_x,(long)qu_1.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _4_4_);
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)j_4);
                _bucket_1 = *pvVar5 + _bucket_1;
              }
              dVar9 = floor((_bucket_1 / (double)iVar2 - min_data) / bucket_w);
              inclasses = (int)dVar9;
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)local_90,&inclasses);
            }
            for (select.
                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                iVar1 = PAA_DIMENSION[i_1],
                sVar6 = std::vector<int,_std::allocator<int>_>::size
                                  ((vector<int,_std::allocator<int>_> *)local_90),
                (ulong)(long)(select.
                              super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + iVar1) <=
                sVar6; select.
                       super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                            select.
                            super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
              select.
              super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
              std::
              vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ::vector((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                        *)&allselect._M_t._M_impl.super__Rb_tree_header._M_node_count);
              std::set<int,_std::less<int>,_std::allocator<int>_>::set
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)local_f8);
              for (local_fc = 0; local_fc < num_c; local_fc = local_fc + 1) {
                queryfromhashmap(&local_130,(vector<int,_std::allocator<int>_> *)local_90,
                                 select.
                                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,i_1,
                                 local_fc);
                std::
                vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ::push_back((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                             *)&allselect._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            &local_130);
                std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_130);
                pvVar7 = std::
                         vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                         ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                       *)&allselect._M_t._M_impl.super__Rb_tree_header._M_node_count
                                      ,(long)local_fc);
                sVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(pvVar7);
                if (sVar8 != 0) {
                  select.
                  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                       (int)select.
                            super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
                  this = &allselect._M_t._M_impl.super__Rb_tree_header._M_node_count;
                  pvVar7 = std::
                           vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                           ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                         *)this,(long)local_fc);
                  __first = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(pvVar7);
                  pvVar7 = std::
                           vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                           ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                         *)this,(long)local_fc);
                  __last = std::set<int,_std::less<int>,_std::allocator<int>_>::end(pvVar7);
                  std::set<int,std::less<int>,std::allocator<int>>::
                  insert<std::_Rb_tree_const_iterator<int>>
                            ((set<int,std::less<int>,std::allocator<int>> *)local_f8,
                             (_Rb_tree_const_iterator<int>)__first._M_node,
                             (_Rb_tree_const_iterator<int>)__last._M_node);
                }
              }
              if ((int)select.
                       super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage == 1) {
                dVar9 = log2(2.0);
                for (tf._4_4_ = 0; tf._4_4_ < num_c; tf._4_4_ = tf._4_4_ + 1) {
                  pvVar7 = std::
                           vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                           ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                         *)&allselect._M_t._M_impl.super__Rb_tree_header.
                                            _M_node_count,(long)tf._4_4_);
                  sVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(pvVar7);
                  if ((int)sVar8 != 0) {
                    now.allcov._M_t._M_impl.super__Rb_tree_header._M_node_count =
                         (size_t)((double)(int)sVar8 / (double)datacnt[tf._4_4_]);
                    paaword::paaword((paaword *)auStack_1e8);
                    _auStack_1e8 = (double)now.allcov._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count * dVar9;
                    now.score._0_4_ = iVar2;
                    pvVar7 = std::
                             vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                             ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                           *)&allselect._M_t._M_impl.super__Rb_tree_header.
                                              _M_node_count,(long)tf._4_4_);
                    std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)
                               &now.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,pvVar7);
                    std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)
                               &now.cov._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (set<int,_std::less<int>,_std::allocator<int>_> *)local_f8);
                    for (local_1ec = 0; local_1ec < PAA_DIMENSION[i_1]; local_1ec = local_1ec + 1) {
                      __x = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)local_90,
                                       (long)(select.
                                              super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _4_4_ + local_1ec));
                      std::vector<int,_std::allocator<int>_>::push_back
                                ((vector<int,_std::allocator<int>_> *)&now.window,__x);
                    }
                    std::vector<paaword,_std::allocator<paaword>_>::push_back
                              (candidates + tf._4_4_,(value_type *)auStack_1e8);
                    paaword::~paaword((paaword *)auStack_1e8);
                  }
                }
              }
              std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)local_f8);
              std::
              vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ::~vector((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                         *)&allselect._M_t._M_impl.super__Rb_tree_header._M_node_count);
            }
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)local_90);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void createwords() {
    int shapelet_minlen = max(DEFAULT_PAA_DIMENSION, (ts_len / 20 + DEFAULT_PAA_DIMENSION - 1)
                                                     / DEFAULT_PAA_DIMENSION * DEFAULT_PAA_DIMENSION);
    for (int len = shapelet_minlen; len <= ts_len; len += shapelet_minlen) {
//        printf("search length %d:\n", len);

        // clear hash map
        for (int i = 0; i < D_NUM; ++i) {
            for (int j = 0; j <= num_c; ++j) {
                tree[i][j].clear();
            }
        }

        for (int d = 0; d < D_NUM; ++d) {
            if (len % PAA_DIMENSION[d] != 0) {
                continue;
            }

            // PAA window
            int window = len / PAA_DIMENSION[d];

            // insert words into hashmap
            for (int i = 0; i < data_n; ++i) {
                for (int start = 0; start < window; ++start) {
                    vector<int> qu;

                    // PAA
                    for (int offset = start; offset + window <= ts_len; offset += window) {
                        double avg = 0;
                        for (int j = offset; j < offset + window; ++j) {
                            avg += data_x[i][j];
                        }
                        int bucket = (int) floor((avg / window - min_data) / bucket_w - 1e-8);
                        qu.push_back(bucket);
                    }

                    // insert into hash map
                    for (int j = 0; j + PAA_DIMENSION[d] <= qu.size(); ++j) {
//                        insertintohashmap(qu, j, d, i);
                        insertintohashmap(qu, j, d, i, len, start);
                    }

                }
            }
//            printf("dimension %d insert finished\n", PAA_DIMENSION[d]);

            // query from hashmap to calculate tfidf score
            for (int i = 0; i < data_n; ++i) {
                for (int start = 0; start < window; ++start) {
                    vector<int> qu;

                    // PAA
                    for (int offset = start; offset + window <= ts_len; offset += window) {
                        double avg = 0;
                        for (int j = offset; j < offset + window; ++j) {
                            avg += data_x[i][j];
                        }
                        int bucket = (int) floor((avg / window - min_data) / bucket_w);
                        qu.push_back(bucket);
                    }

                    // query from hash map
                    for (int j = 0; j + PAA_DIMENSION[d] <= qu.size(); ++j) {

                        int inclasses = 0;

                        vector<set<int> > select;
                        set<int> allselect;
                        for (int k = 0; k < num_c; ++k) {
                            select.push_back(queryfromhashmap(qu, j, d, k));
                            if (select[k].size() != 0) {
                                ++inclasses;
                                allselect.insert(select[k].begin(), select[k].end());
                            }
                        }

                        if (inclasses != 1) {
                            continue;
                        }
                        double idf = log2(2.0);

//                        double idf = log2((double) (num_c) / inclasses);

                        for (int k = 0; k < num_c; ++k) {

                            int inthisclass = (int) select[k].size();

                            if (inthisclass == 0) {
                                continue;
                            }

                            double tf = (double) (inthisclass) / datacnt[k];

                            paaword now;
                            now.window = window;
                            now.score = tf * idf;
                            now.cov = select[k];
                            now.allcov = allselect;
                            for (int cp = 0; cp < PAA_DIMENSION[d]; ++cp) {
                                now.vec.push_back(qu[j + cp]);
                            }
                            candidates[k].push_back(now);

                        }
                    }
                }
            }
//            printf("dimension %d query finished\n", PAA_DIMENSION[d]);
        }
    }
}